

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_find_best_sub_pixel_tree
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  long lVar1;
  byte bVar2;
  SUBPEL_SEARCH_TYPE SVar3;
  MV_COST_TYPE MVar4;
  ushort uVar5;
  ushort uVar6;
  MV MVar7;
  MV_COST_PARAMS *pMVar8;
  MACROBLOCKD *pMVar9;
  AV1_COMMON *pAVar10;
  MV *pMVar11;
  int iVar12;
  uint uVar13;
  scale_factors *psVar14;
  uint uVar15;
  int iVar16;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  short sVar21;
  short sVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  short sVar26;
  short sVar27;
  SubpelMvLimits *pSVar28;
  SUBPEL_SEARCH_VAR_PARAMS *pSVar29;
  short sVar30;
  short sVar31;
  uint uVar32;
  byte bVar33;
  bool bVar34;
  uint besterr;
  MV left_mv;
  MV bottom_mv;
  MV left_mv_1;
  MV top_mv;
  MV right_mv;
  MV local_b4;
  MV_COST_PARAMS *local_b0;
  SubpelMvLimits *local_a8;
  MACROBLOCKD *local_a0;
  AV1_COMMON *local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  SUBPEL_SEARCH_VAR_PARAMS *local_78;
  MV *local_70;
  ulong local_68;
  ulong local_60;
  uint local_54;
  ulong local_50;
  int local_44;
  ulong local_40;
  uint local_38;
  uint local_34;
  ulong uVar17;
  
  bVar2 = ms_params->forced_stop;
  local_44 = ms_params->iters_per_step;
  SVar3 = (ms_params->var_params).subpel_search_type;
  uVar18 = 3 - (ms_params->allow_hp == 0);
  if ((int)(3 - bVar2) < (int)uVar18) {
    uVar18 = 3 - bVar2;
  }
  besterr = 0x7fffffff;
  *bestmv = start_mv;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    psVar14 = xd->block_ref_scale_factors[0];
  }
  else {
    psVar14 = &cm->sf_identity;
  }
  local_60 = 0;
  if (((psVar14->x_scale_fp != -1) && (psVar14->y_scale_fp != -1)) &&
     (local_60 = 1, psVar14->x_scale_fp == 0x4000)) {
    local_60 = (ulong)(psVar14->y_scale_fp != 0x4000);
  }
  local_b0 = &ms_params->mv_cost_params;
  pSVar29 = &ms_params->var_params;
  if ((start_mv_stats == (FULLPEL_MV_STATS *)0x0) || ((int)local_60 != 0)) {
    if (SVar3 == '\0') {
      besterr = setup_center_error(xd,bestmv,pSVar29,local_b0,sse1,distortion);
    }
    else {
      besterr = upsampled_setup_center_error(xd,cm,bestmv,pSVar29,local_b0,sse1,distortion);
    }
  }
  else {
    besterr = start_mv_stats->err_cost + start_mv_stats->distortion;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  }
  local_a8 = &ms_params->mv_limits;
  bVar33 = bVar2 < 3;
  if (bVar2 != 3) {
    if ((bool)bVar33) {
      uVar23 = (ulong)uVar18;
      lVar24 = -uVar23;
      uVar20 = 4;
      uVar25 = 1;
      local_a0 = xd;
      local_98 = cm;
      local_88 = lVar24;
      local_80 = uVar23;
      local_78 = pSVar29;
      local_70 = bestmv;
      do {
        pMVar11 = local_70;
        pMVar9 = local_a0;
        uVar5 = bestmv->row;
        local_40 = (ulong)uVar5;
        uVar6 = bestmv->col;
        local_50 = (ulong)uVar6;
        cm = (AV1_COMMON *)CONCAT71((int7)((ulong)cm >> 8),1);
        if (last_mv_search_list != (int_mv *)0x0) {
          if ((uVar5 == last_mv_search_list[uVar25 - 1].as_mv.row) &&
             (uVar6 == *(ushort *)((long)last_mv_search_list + uVar25 * 4 + -2))) {
            cm = (AV1_COMMON *)0x0;
          }
          else {
            last_mv_search_list[uVar25 - 1].as_mv.row = uVar5;
            *(ushort *)((long)last_mv_search_list + uVar25 * 4 + -2) = uVar6;
          }
        }
        if ((char)cm != '\0') {
          sVar30 = (short)uVar20;
          left_mv.col = uVar6 - sVar30;
          if (SVar3 == '\0') {
            local_54 = (uint)cm;
            local_68 = CONCAT71(local_68._1_7_,bVar33);
            left_mv_1.col = left_mv.col;
            left_mv_1.row = uVar5;
            left_mv.row = 0;
            left_mv.col = 0;
            local_90 = uVar20;
            local_34 = check_better_fast(local_a0,local_98,&left_mv_1,local_70,local_a8,pSVar29,
                                         local_b0,&besterr,sse1,distortion,(int *)&left_mv,
                                         (int)local_60);
            pSVar29 = local_78;
            pAVar10 = local_98;
            pSVar28 = local_a8;
            pMVar8 = local_b0;
            right_mv.col = (short)local_90 + uVar6;
            right_mv.row = uVar5;
            iVar12 = (int)local_60;
            local_38 = check_better_fast(pMVar9,local_98,&right_mv,pMVar11,local_a8,local_78,
                                         local_b0,&besterr,sse1,distortion,(int *)&left_mv,iVar12);
            pMVar11 = local_70;
            sVar30 = (short)local_40;
            top_mv.col = uVar6;
            top_mv.row = sVar30 - (short)local_90;
            uVar32 = check_better_fast(local_a0,pAVar10,&top_mv,local_70,pSVar28,pSVar29,pMVar8,
                                       &besterr,sse1,distortion,(int *)&left_mv,iVar12);
            uVar20 = local_90;
            bottom_mv.col = (int16_t)local_50;
            bottom_mv.row = (short)local_90 + sVar30;
            uVar13 = check_better_fast(local_a0,local_98,&bottom_mv,pMVar11,pSVar28,pSVar29,pMVar8,
                                       &besterr,sse1,distortion,(int *)&left_mv,iVar12);
            bestmv = local_70;
            pSVar29 = local_78;
            uVar15 = (uint)uVar20;
            uVar18 = uVar15;
            if (uVar32 <= uVar13) {
              uVar18 = -uVar15;
            }
            if (local_34 <= local_38) {
              uVar15 = -uVar15;
            }
            sVar31 = (short)local_50;
            uVar32 = uVar18 & 0xffff | uVar15 << 0x10;
            sVar30 = (short)local_40;
            local_b4.col = sVar31 + (short)uVar15;
            local_b4.row = (short)uVar18 + sVar30;
            check_better_fast(local_a0,local_98,&local_b4,local_70,local_a8,local_78,local_b0,
                              &besterr,sse1,distortion,(int *)&left_mv,(int)local_60);
            cm = (AV1_COMMON *)(ulong)local_54;
            uVar23 = local_80;
            lVar24 = local_88;
            bVar33 = (byte)local_68;
          }
          else {
            left_mv.row = uVar5;
            right_mv.col = uVar6 + sVar30;
            right_mv.row = uVar5;
            top_mv.col = uVar6;
            top_mv.row = uVar5 - sVar30;
            bottom_mv.col = uVar6;
            bottom_mv.row = sVar30 + uVar5;
            uVar18 = 0x7fffffff;
            if ((local_a8->col_min <= (int)left_mv.col) &&
               (uVar18 = 0x7fffffff, (int)left_mv.col <= (ms_params->mv_limits).col_max)) {
              uVar18 = 0x7fffffff;
              if (((ms_params->mv_limits).row_min <= (int)(short)uVar5) &&
                 (uVar18 = 0x7fffffff, (int)(short)uVar5 <= (ms_params->mv_limits).row_max)) {
                iVar12 = upsampled_pref_error
                                   (local_a0,local_98,&left_mv,local_78,(uint *)&left_mv_1);
                MVar4 = (ms_params->mv_cost_params).mv_cost_type;
                iVar16 = 0;
                if (MVar4 != '\x04') {
                  sVar30 = local_b0->ref_mv->row;
                  sVar26 = left_mv.row - sVar30;
                  sVar31 = local_b0->ref_mv->col;
                  sVar21 = left_mv.col - sVar31;
                  sVar27 = -sVar26;
                  if (0 < sVar26) {
                    sVar27 = sVar26;
                  }
                  sVar22 = -sVar21;
                  if (0 < sVar21) {
                    sVar22 = sVar21;
                  }
                  if (MVar4 == '\x03') {
                    iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                  }
                  else if (MVar4 == '\x01') {
                    iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                  }
                  else if (MVar4 == '\0') {
                    iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar21] +
                                    (long)(ms_params->mv_cost_params).mvcost[0][sVar26] +
                                   (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                                 (ulong)((uint)(left_mv.col != sVar31) * 4 +
                                                        (uint)(left_mv.row != sVar30) * 8))) *
                                   (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe)
                    ;
                  }
                }
                uVar18 = iVar16 + iVar12;
                uVar23 = local_80;
                lVar24 = local_88;
                if (uVar18 < besterr) {
                  *local_70 = left_mv;
                  *distortion = iVar12;
                  *sse1 = (uint)left_mv_1;
                  besterr = uVar18;
                }
              }
            }
            uVar17 = 0x7fffffff;
            if ((((local_a8->col_min <= (int)right_mv >> 0x10) &&
                 ((int)right_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
                ((ms_params->mv_limits).row_min <= (int)right_mv.row)) &&
               ((int)right_mv.row <= (ms_params->mv_limits).row_max)) {
              iVar12 = upsampled_pref_error(local_a0,local_98,&right_mv,local_78,(uint *)&left_mv_1)
              ;
              MVar4 = (ms_params->mv_cost_params).mv_cost_type;
              iVar16 = 0;
              if (MVar4 != '\x04') {
                sVar30 = local_b0->ref_mv->row;
                sVar26 = right_mv.row - sVar30;
                sVar31 = local_b0->ref_mv->col;
                sVar21 = right_mv.col - sVar31;
                sVar27 = -sVar26;
                if (0 < sVar26) {
                  sVar27 = sVar26;
                }
                sVar22 = -sVar21;
                if (0 < sVar21) {
                  sVar22 = sVar21;
                }
                if (MVar4 == '\x03') {
                  iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                }
                else if (MVar4 == '\x01') {
                  iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                }
                else if (MVar4 == '\0') {
                  iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar21] +
                                  (long)(ms_params->mv_cost_params).mvcost[0][sVar26] +
                                 (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                               (ulong)((uint)(right_mv.col != sVar31) * 4 +
                                                      (uint)(right_mv.row != sVar30) * 8))) *
                                 (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
                }
              }
              uVar15 = iVar16 + iVar12;
              uVar17 = (ulong)uVar15;
              uVar23 = local_80;
              lVar24 = local_88;
              if (uVar15 < besterr) {
                *local_70 = right_mv;
                *distortion = iVar12;
                *sse1 = (uint)left_mv_1;
                besterr = uVar15;
              }
            }
            pSVar28 = local_a8;
            uVar15 = 0x7fffffff;
            uVar32 = 0x7fffffff;
            if ((local_a8->col_min <= (int)top_mv >> 0x10) &&
               (uVar32 = 0x7fffffff, (int)top_mv >> 0x10 <= (ms_params->mv_limits).col_max)) {
              uVar32 = 0x7fffffff;
              if (((ms_params->mv_limits).row_min <= (int)top_mv.row) &&
                 (uVar32 = 0x7fffffff, (int)top_mv.row <= (ms_params->mv_limits).row_max)) {
                local_90 = uVar20;
                local_68 = uVar17;
                iVar12 = upsampled_pref_error(local_a0,local_98,&top_mv,local_78,(uint *)&left_mv_1)
                ;
                MVar4 = (ms_params->mv_cost_params).mv_cost_type;
                iVar16 = 0;
                if (MVar4 != '\x04') {
                  sVar30 = local_b0->ref_mv->row;
                  sVar21 = top_mv.row - sVar30;
                  sVar31 = local_b0->ref_mv->col;
                  sVar26 = top_mv.col - sVar31;
                  sVar27 = -sVar21;
                  if (0 < sVar21) {
                    sVar27 = sVar21;
                  }
                  sVar22 = -sVar26;
                  if (0 < sVar26) {
                    sVar22 = sVar26;
                  }
                  pSVar28 = local_a8;
                  if (MVar4 == '\x03') {
                    iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                  }
                  else if (MVar4 == '\x01') {
                    iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                  }
                  else if (MVar4 == '\0') {
                    iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar26] +
                                    (long)(ms_params->mv_cost_params).mvcost[0][sVar21] +
                                   (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                                 (ulong)((uint)(top_mv.col != sVar31) * 4 +
                                                        (uint)(top_mv.row != sVar30) * 8))) *
                                   (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe)
                    ;
                  }
                }
                uVar32 = iVar16 + iVar12;
                uVar17 = local_68;
                uVar20 = local_90;
                uVar23 = local_80;
                lVar24 = local_88;
                if (uVar32 < besterr) {
                  *local_70 = top_mv;
                  *distortion = iVar12;
                  *sse1 = (uint)left_mv_1;
                  besterr = uVar32;
                }
              }
            }
            if (((pSVar28->col_min <= (int)bottom_mv >> 0x10) &&
                ((int)bottom_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
               (((ms_params->mv_limits).row_min <= (int)bottom_mv.row &&
                ((int)bottom_mv.row <= (ms_params->mv_limits).row_max)))) {
              local_90 = uVar20;
              local_68 = uVar17;
              iVar12 = upsampled_pref_error
                                 (local_a0,local_98,&bottom_mv,local_78,(uint *)&left_mv_1);
              MVar4 = (ms_params->mv_cost_params).mv_cost_type;
              iVar16 = 0;
              if (MVar4 != '\x04') {
                sVar30 = local_b0->ref_mv->row;
                sVar21 = bottom_mv.row - sVar30;
                sVar31 = local_b0->ref_mv->col;
                sVar26 = bottom_mv.col - sVar31;
                sVar27 = -sVar21;
                if (0 < sVar21) {
                  sVar27 = sVar21;
                }
                sVar22 = -sVar26;
                if (0 < sVar26) {
                  sVar22 = sVar26;
                }
                if (MVar4 == '\x03') {
                  iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                }
                else if (MVar4 == '\x01') {
                  iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                }
                else if (MVar4 == '\0') {
                  iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar26] +
                                  (long)(ms_params->mv_cost_params).mvcost[0][sVar21] +
                                 (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                               (ulong)((uint)(bottom_mv.col != sVar31) * 4 +
                                                      (uint)(bottom_mv.row != sVar30) * 8))) *
                                 (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
                }
              }
              uVar15 = iVar16 + iVar12;
              uVar17 = local_68;
              uVar20 = local_90;
              uVar23 = local_80;
              lVar24 = local_88;
              if (uVar15 < besterr) {
                *local_70 = bottom_mv;
                *distortion = iVar12;
                *sse1 = (uint)left_mv_1;
                besterr = uVar15;
              }
            }
            uVar19 = (uint)uVar20;
            uVar13 = uVar19;
            if (uVar32 <= uVar15) {
              uVar13 = -uVar19;
            }
            if (uVar18 <= (uint)uVar17) {
              uVar19 = -uVar19;
            }
            local_b4.row = (short)local_40 + (short)uVar13;
            local_b4.col = (short)local_50 + (short)uVar19;
            if ((((local_a8->col_min <= (int)local_b4.col) &&
                 ((int)local_b4.col <= (ms_params->mv_limits).col_max)) &&
                ((ms_params->mv_limits).row_min <= (int)local_b4.row)) &&
               ((int)local_b4.row <= (ms_params->mv_limits).row_max)) {
              local_90 = uVar20;
              iVar12 = upsampled_pref_error(local_a0,local_98,&local_b4,local_78,(uint *)&left_mv_1)
              ;
              MVar4 = (ms_params->mv_cost_params).mv_cost_type;
              iVar16 = 0;
              if (MVar4 != '\x04') {
                sVar30 = local_b0->ref_mv->row;
                sVar21 = local_b4.row - sVar30;
                sVar31 = local_b0->ref_mv->col;
                sVar26 = local_b4.col - sVar31;
                sVar27 = -sVar21;
                if (0 < sVar21) {
                  sVar27 = sVar21;
                }
                sVar22 = -sVar26;
                if (0 < sVar26) {
                  sVar22 = sVar26;
                }
                if (MVar4 == '\x03') {
                  iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                }
                else if (MVar4 == '\x01') {
                  iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                }
                else if (MVar4 == '\0') {
                  iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar26] +
                                  (long)(ms_params->mv_cost_params).mvcost[0][sVar21] +
                                 (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                               (ulong)((uint)(local_b4.col != sVar31) * 4 +
                                                      (uint)(local_b4.row != sVar30) * 8))) *
                                 (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
                }
              }
              uVar20 = local_90;
              uVar23 = local_80;
              lVar24 = local_88;
              if ((uint)(iVar16 + iVar12) < besterr) {
                *local_70 = local_b4;
                *distortion = iVar12;
                *sse1 = (uint)left_mv_1;
                besterr = iVar16 + iVar12;
              }
            }
            uVar32 = uVar13 & 0xffff | uVar19 << 0x10;
            sVar31 = (short)local_50;
            sVar30 = (short)local_40;
            bestmv = local_70;
            pSVar29 = local_78;
          }
          pAVar10 = local_98;
          pMVar9 = local_a0;
          pSVar28 = local_a8;
          pMVar8 = local_b0;
          sVar27 = bestmv->row;
          if (sVar30 == sVar27) {
            bVar34 = sVar31 != bestmv->col;
            sVar31 = (short)local_50;
            if (bVar34 && 1 < local_44) {
LAB_001d4808:
              sVar21 = (short)(uVar32 >> 0x10);
              if (sVar30 == sVar27) {
                if (sVar31 == bestmv->col) goto LAB_001d4c47;
                if (sVar30 != sVar27) goto LAB_001d4828;
                uVar32 = -uVar32;
              }
              else {
LAB_001d4828:
                if (sVar31 == bestmv->col) {
                  sVar21 = -sVar21;
                }
              }
              left_mv.row = (short)uVar32 + sVar27;
              left_mv.col = bestmv->col;
              right_mv.col = sVar21 + left_mv.col;
              right_mv.row = sVar27;
              top_mv.col = sVar21 + left_mv.col;
              top_mv.row = left_mv.row;
              bottom_mv.row = 0;
              bottom_mv.col = 0;
              local_54 = (uint)cm;
              local_90 = uVar20;
              if ((ms_params->var_params).subpel_search_type == '\0') {
                local_68 = CONCAT71(local_68._1_7_,bVar33);
                iVar12 = (int)local_60;
                check_better_fast(local_a0,local_98,&left_mv,bestmv,local_a8,pSVar29,local_b0,
                                  &besterr,sse1,distortion,(int *)&bottom_mv,iVar12);
                pSVar29 = local_78;
                check_better_fast(pMVar9,pAVar10,&right_mv,bestmv,pSVar28,local_78,pMVar8,&besterr,
                                  sse1,distortion,(int *)&bottom_mv,iVar12);
                uVar23 = local_80;
                lVar24 = local_88;
                bVar33 = (byte)local_68;
                if (bottom_mv != (MV)0x0) {
                  check_better_fast(local_a0,local_98,&top_mv,bestmv,local_a8,pSVar29,local_b0,
                                    &besterr,sse1,distortion,(int *)&bottom_mv,(int)local_60);
                  uVar23 = local_80;
                  lVar24 = local_88;
                  bVar33 = (byte)local_68;
                }
              }
              else {
                if (((local_a8->col_min <= (int)left_mv.col) &&
                    ((int)left_mv.col <= (ms_params->mv_limits).col_max)) &&
                   (((ms_params->mv_limits).row_min <= (int)left_mv.row &&
                    ((int)left_mv.row <= (ms_params->mv_limits).row_max)))) {
                  iVar12 = upsampled_pref_error
                                     (local_a0,local_98,&left_mv,pSVar29,(uint *)&left_mv_1);
                  MVar4 = (ms_params->mv_cost_params).mv_cost_type;
                  iVar16 = 0;
                  if (MVar4 != '\x04') {
                    sVar30 = local_b0->ref_mv->row;
                    sVar21 = left_mv.row - sVar30;
                    sVar31 = local_b0->ref_mv->col;
                    sVar26 = left_mv.col - sVar31;
                    sVar27 = -sVar21;
                    if (0 < sVar21) {
                      sVar27 = sVar21;
                    }
                    sVar22 = -sVar26;
                    if (0 < sVar26) {
                      sVar22 = sVar26;
                    }
                    if (MVar4 == '\x03') {
                      iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                    }
                    else if (MVar4 == '\x01') {
                      iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                    }
                    else if (MVar4 == '\0') {
                      iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar26] +
                                      (long)(ms_params->mv_cost_params).mvcost[0][sVar21] +
                                     (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                                   (ulong)((uint)(left_mv.col != sVar31) * 4 +
                                                          (uint)(left_mv.row != sVar30) * 8))) *
                                     (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >>
                                    0xe);
                    }
                  }
                  uVar23 = local_80;
                  lVar24 = local_88;
                  if ((uint)(iVar16 + iVar12) < besterr) {
                    *bestmv = left_mv;
                    *distortion = iVar12;
                    *sse1 = (uint)left_mv_1;
                    bottom_mv.row = 1;
                    bottom_mv.col = 0;
                    besterr = iVar16 + iVar12;
                  }
                }
                if (((local_a8->col_min <= (int)right_mv >> 0x10) &&
                    ((int)right_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
                   (((ms_params->mv_limits).row_min <= (int)right_mv.row &&
                    ((int)right_mv.row <= (ms_params->mv_limits).row_max)))) {
                  iVar12 = upsampled_pref_error
                                     (local_a0,local_98,&right_mv,pSVar29,(uint *)&left_mv_1);
                  MVar4 = (ms_params->mv_cost_params).mv_cost_type;
                  iVar16 = 0;
                  if (MVar4 != '\x04') {
                    sVar30 = local_b0->ref_mv->row;
                    sVar21 = right_mv.row - sVar30;
                    sVar31 = local_b0->ref_mv->col;
                    sVar26 = right_mv.col - sVar31;
                    sVar27 = -sVar21;
                    if (0 < sVar21) {
                      sVar27 = sVar21;
                    }
                    sVar22 = -sVar26;
                    if (0 < sVar26) {
                      sVar22 = sVar26;
                    }
                    if (MVar4 == '\x03') {
                      iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                    }
                    else if (MVar4 == '\x01') {
                      iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                    }
                    else if (MVar4 == '\0') {
                      iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar26] +
                                      (long)(ms_params->mv_cost_params).mvcost[0][sVar21] +
                                     (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                                   (ulong)((uint)(right_mv.col != sVar31) * 4 +
                                                          (uint)(right_mv.row != sVar30) * 8))) *
                                     (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >>
                                    0xe);
                    }
                  }
                  uVar23 = local_80;
                  lVar24 = local_88;
                  if ((uint)(iVar16 + iVar12) < besterr) {
                    *bestmv = right_mv;
                    *distortion = iVar12;
                    *sse1 = (uint)left_mv_1;
                    bottom_mv = (MV)((uint)bottom_mv | 1);
                    besterr = iVar16 + iVar12;
                  }
                }
                MVar7 = bottom_mv;
                if ((((bottom_mv != (MV)0x0) && (local_a8->col_min <= (int)top_mv >> 0x10)) &&
                    ((int)top_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
                   (((ms_params->mv_limits).row_min <= (int)top_mv.row &&
                    ((int)top_mv.row <= (ms_params->mv_limits).row_max)))) {
                  iVar12 = upsampled_pref_error
                                     (local_a0,local_98,&top_mv,pSVar29,(uint *)&left_mv_1);
                  MVar4 = (ms_params->mv_cost_params).mv_cost_type;
                  iVar16 = 0;
                  if (MVar4 != '\x04') {
                    sVar30 = local_b0->ref_mv->row;
                    sVar21 = top_mv.row - sVar30;
                    sVar31 = local_b0->ref_mv->col;
                    sVar26 = top_mv.col - sVar31;
                    sVar27 = -sVar21;
                    if (0 < sVar21) {
                      sVar27 = sVar21;
                    }
                    sVar22 = -sVar26;
                    if (0 < sVar26) {
                      sVar22 = sVar26;
                    }
                    if (MVar4 == '\x03') {
                      iVar16 = (int)sVar22 + (int)sVar27 >> 3;
                    }
                    else if (MVar4 == '\x01') {
                      iVar16 = (int)sVar22 + (int)sVar27 >> 2;
                    }
                    else if (MVar4 == '\0') {
                      iVar16 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar26] +
                                      (long)(ms_params->mv_cost_params).mvcost[0][sVar21] +
                                     (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                                   (ulong)((uint)(top_mv.col != sVar31) * 4 +
                                                          (uint)(top_mv.row != sVar30) * 8))) *
                                     (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >>
                                    0xe);
                    }
                  }
                  uVar23 = local_80;
                  lVar24 = local_88;
                  if ((uint)(iVar16 + iVar12) < besterr) {
                    *bestmv = top_mv;
                    *distortion = iVar12;
                    *sse1 = (uint)left_mv_1;
                    bottom_mv = (MV)((uint)MVar7 | 1);
                    besterr = iVar16 + iVar12;
                  }
                }
              }
              cm = (AV1_COMMON *)(ulong)local_54;
              uVar20 = local_90;
            }
          }
          else if (1 < local_44) goto LAB_001d4808;
LAB_001d4c47:
          uVar20 = (ulong)(uint)((int)uVar20 >> 1);
        }
        if ((char)cm == '\0') break;
        bVar33 = uVar25 < uVar23;
        lVar1 = lVar24 + uVar25;
        uVar25 = uVar25 + 1;
      } while (lVar1 != 0);
    }
    if ((bVar33 & 1) != 0) {
      return 0x7fffffff;
    }
  }
  return besterr;
}

Assistant:

int av1_find_best_sub_pixel_tree(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                 const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                 MV start_mv,
                                 const FULLPEL_MV_STATS *start_mv_stats,
                                 MV *bestmv, int *distortion,
                                 unsigned int *sse1,
                                 int_mv *last_mv_search_list) {
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  // How many steps to take. A round of 0 means fullpel search only, 1 means
  // half-pel, and so on.
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel

  unsigned int besterr = INT_MAX;

  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      besterr = upsampled_setup_center_error(xd, cm, bestmv, var_params,
                                             mv_cost_params, sse1, distortion);
    } else {
      besterr = setup_center_error(xd, bestmv, var_params, mv_cost_params, sse1,
                                   distortion);
    }
  }

  // If forced_stop is FULL_PEL, return.
  if (!round) return besterr;

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    if (check_repeated_mv_and_update(last_mv_search_list, iter_center_mv,
                                     iter)) {
      return INT_MAX;
    }

    MV diag_step;
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      diag_step = first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                    mv_limits, var_params, mv_cost_params,
                                    &besterr, sse1, distortion);
    } else {
      diag_step = first_level_check_fast(xd, cm, iter_center_mv, bestmv, hstep,
                                         mv_limits, var_params, mv_cost_params,
                                         &besterr, sse1, distortion, is_scaled);
    }

    // Check diagonal sub-pixel position
    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                            mv_limits, var_params, mv_cost_params, &besterr,
                            sse1, distortion, is_scaled);
    }

    hstep >>= 1;
  }

  return besterr;
}